

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap.c
# Opt level: O2

int swap_little_endian(void)

{
  return 1;
}

Assistant:

int
swap_little_endian()
{
    uint32 l;
    char *c;

    l = 1;

    c = (char *)&l;

    if (*c) {
	return TRUE;
    }
    else {
	return FALSE;
    }
}